

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall cfd::core::AdaptorProof::AdaptorProof(AdaptorProof *this,string *data)

{
  ByteData local_30;
  string *local_18;
  string *data_local;
  AdaptorProof *this_local;
  
  local_18 = data;
  data_local = (string *)this;
  ByteData::ByteData(&local_30,data);
  AdaptorProof(this,&local_30);
  ByteData::~ByteData(&local_30);
  return;
}

Assistant:

AdaptorProof::AdaptorProof(const std::string &data)
    : AdaptorProof(ByteData(data)) {}